

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall CVmByteArraySource::seek(CVmByteArraySource *this,long ofs,int mode)

{
  int mode_local;
  long ofs_local;
  CVmByteArraySource *this_local;
  
  if (mode == 0) {
    this->idx = this->start_idx + ofs;
  }
  else if (mode == 1) {
    this->idx = ofs + this->idx;
  }
  else {
    if (mode != 2) {
      return 1;
    }
    this->idx = this->end_idx + ofs;
  }
  if (this->idx < this->start_idx) {
    this->idx = this->start_idx;
  }
  else if (this->end_idx < this->idx) {
    this->idx = this->end_idx;
  }
  return 0;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        switch (mode)
        {
        case OSFSK_SET:
            idx = start_idx + ofs;
            break;

        case OSFSK_CUR:
            idx += ofs;
            break;

        case OSFSK_END:
            idx = end_idx + ofs;
            break;

        default:
            return 1;
        }

        /* make sure it's in range */
        if (idx < start_idx)
            idx = start_idx;
        else if (idx > end_idx)
            idx = end_idx;

        /* success */
        return 0;
    }